

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O2

pair<long,_long> get_thread_range(ggml_compute_params *params,ggml_tensor *src0)

{
  int iVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  pair<long,_long> pVar6;
  
  iVar1 = params->ith;
  iVar2 = params->nth;
  lVar3 = ggml_nrows(src0);
  lVar4 = ((long)iVar2 + -1 + lVar3) / (long)iVar2;
  lVar5 = iVar1 * lVar4;
  lVar4 = lVar4 + lVar5;
  if (lVar4 < lVar3) {
    lVar3 = lVar4;
  }
  pVar6.second = lVar3;
  pVar6.first = lVar5;
  return pVar6;
}

Assistant:

static std::pair<int64_t, int64_t> get_thread_range(const struct ggml_compute_params * params, const struct ggml_tensor * src0) {
    const int64_t ith = params->ith;
    const int64_t nth = params->nth;

    const int64_t nr  = ggml_nrows(src0);

    // rows per thread
    const int64_t dr = (nr + nth - 1)/nth;

    // row range for this thread
    const int64_t ir0 = dr*ith;
    const int64_t ir1 = MIN(ir0 + dr, nr);

    return {ir0, ir1};
}